

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O0

gs_val_t *
gs_c_fn_terrain_model_add_point
          (gs_val_t *__return_storage_ptr__,gs_eval_t *eval,gs_val_t *vals,int num_vals)

{
  golf_geo_point_t point_00;
  golf_geo_point_t point;
  gs_val_t sig;
  gs_val_type local_20;
  int signature_arg_count;
  gs_val_type signature_arg_types [1];
  int num_vals_local;
  gs_val_t *vals_local;
  gs_eval_t *eval_local;
  
  local_20 = GS_VAL_VEC3;
  signature_arg_count = num_vals;
  _signature_arg_types = vals;
  gs_c_fn_signature((gs_val_t *)&point.position.y,eval,vals,num_vals,&local_20,1);
  if (((uint)point.position.z & 1) == 0) {
    point_00 = golf_geo_point((_signature_arg_types->field_2).vec3_val);
    golf_editor_edit_mode_geo_add_point(point_00);
    gs_val_void();
  }
  else {
    __return_storage_ptr__->type = (gs_val_type)point.position.y;
    __return_storage_ptr__->is_return = (_Bool)SUB41(point.position.z,0);
    *(int3 *)&__return_storage_ptr__->field_0x5 = (int3)((uint)point.position.z >> 8);
    (__return_storage_ptr__->field_2).vec2_val = (vec2)sig._0_8_;
    *(vec2 *)((long)&__return_storage_ptr__->field_2 + 8) = sig.field_2.vec2_val;
  }
  return __return_storage_ptr__;
}

Assistant:

static gs_val_t gs_c_fn_terrain_model_add_point(gs_eval_t *eval, gs_val_t *vals, int num_vals) {
    gs_val_type signature_arg_types[] = { GS_VAL_VEC3 };
    int signature_arg_count = sizeof(signature_arg_types) / sizeof(signature_arg_types[0]);;
    gs_val_t sig = gs_c_fn_signature(eval, vals, num_vals, signature_arg_types, signature_arg_count);
    if (sig.is_return) return sig;

    golf_geo_point_t point = golf_geo_point(vals[0].vec3_val);
    golf_editor_edit_mode_geo_add_point(point);
    return gs_val_void();
}